

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_disto.c
# Opt level: O2

int main(int argc,char **argv)

{
  uint8_t *plane;
  undefined1 uVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  int type;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  uint32_t *puVar9;
  uint32_t *puVar10;
  uint8_t uVar11;
  int y;
  int iVar12;
  int iVar13;
  int iVar14;
  size_t sVar15;
  size_t sVar16;
  char *__s1;
  void *__ptr;
  ulong uVar17;
  int x_stride;
  int iVar18;
  long lVar19;
  long lVar20;
  byte *pbVar21;
  ulong uVar22;
  int keep_alpha;
  int iVar23;
  uint uVar24;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 uVar25;
  ulong uVar26;
  byte bVar27;
  uint uVar28;
  long lVar29;
  uint uVar30;
  uint uVar31;
  void *pvVar32;
  char *pcVar33;
  uint uVar34;
  FILE *__stream;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  uint uVar38;
  uint8_t *in_R9;
  ulong uVar39;
  ulong uVar40;
  long lVar41;
  int iVar42;
  int iVar43;
  long lVar44;
  int iVar45;
  long lVar46;
  double dVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined4 uVar50;
  undefined4 uVar51;
  size_t sStack_330;
  int local_328;
  byte *local_320;
  char *local_318;
  uint8_t *data;
  int local_2cc;
  int local_2c8;
  uint local_2c4;
  long local_2c0;
  char *local_2b8;
  ulong local_2b0;
  ulong local_2a8;
  ulong local_2a0;
  float disto [5];
  WebPPicture pic1;
  WebPPicture pic2;
  
  iVar12 = WebPPictureInit(&pic1);
  if ((iVar12 == 0) || (iVar12 = WebPPictureInit(&pic2), iVar12 == 0)) {
    fwrite("Can\'t init pictures\n",0x14,1,stderr);
    return 1;
  }
  type = 0;
  local_328 = 1;
  bVar8 = false;
  bVar5 = false;
  bVar6 = false;
  bVar7 = false;
  local_318 = (char *)0x0;
  local_320 = (byte *)0x0;
  pcVar33 = (char *)0x0;
  uVar25 = extraout_RDX;
  for (iVar12 = 1; iVar14 = local_328, iVar12 < argc; iVar12 = iVar12 + 1) {
    __s1 = argv[iVar12];
    iVar13 = strcmp(__s1,"-ssim");
    if (iVar13 == 0) {
      type = 1;
      uVar25 = extraout_RDX_00;
      __s1 = local_318;
    }
    else {
      iVar13 = strcmp(__s1,"-psnr");
      if (iVar13 == 0) {
        type = 0;
        uVar25 = extraout_RDX_01;
        __s1 = local_318;
      }
      else {
        iVar13 = strcmp(__s1,"-alpha");
        if (iVar13 == 0) {
          bVar5 = true;
          uVar25 = extraout_RDX_02;
          __s1 = local_318;
        }
        else {
          iVar13 = strcmp(__s1,"-scale");
          if (iVar13 == 0) {
            bVar6 = true;
            uVar25 = extraout_RDX_03;
            __s1 = local_318;
          }
          else {
            iVar13 = strcmp(__s1,"-gray");
            uVar25 = extraout_RDX_04;
            if (iVar13 == 0) {
              bVar7 = true;
              __s1 = local_318;
            }
            else if (*__s1 == '-') {
              if ((__s1[1] == 'h') && (__s1[2] == '\0')) {
                local_328 = 0;
                bVar8 = true;
                __s1 = local_318;
              }
              else {
                if ((__s1[1] != 'o') || (__s1[2] != '\0')) goto LAB_0010370c;
                iVar12 = iVar12 + 1;
                if (iVar12 == argc) {
                  pcVar33 = "missing file name after %s option.\n";
                  __stream = stderr;
                  goto LAB_00103967;
                }
                pcVar33 = argv[iVar12];
                __s1 = local_318;
              }
            }
            else {
LAB_0010370c:
              if (local_318 != (char *)0x0) {
                local_320 = (byte *)__s1;
                __s1 = local_318;
              }
            }
          }
        }
      }
    }
    local_318 = __s1;
  }
  if (((bVar8) || (local_318 == (char *)0x0)) || (local_320 == (byte *)0x0)) {
    if (!bVar8) {
      fwrite("Error: missing arguments.\n",0x1a,1,stderr);
    }
    __stream = stderr;
    __s1 = WebPGetEnabledInputFileFormats();
    pcVar33 = 
    "Usage: get_disto [-ssim][-psnr][-alpha] compressed.webp orig.webp\n  -ssim ..... print SSIM distortion\n  -psnr ..... print PSNR distortion (default)\n  -alpha .... preserve alpha plane\n  -h ........ this message\n  -o <file> . save the diff map as a WebP lossless file\n  -scale .... scale the difference map to fit [0..255] range\n  -gray ..... use grayscale for difference map (-scale)\n\nSupported input formats:\n  %s\n"
    ;
LAB_00103967:
    fprintf(__stream,pcVar33,__s1);
  }
  else {
    local_2b8 = pcVar33;
    sVar15 = ReadPicture(local_318,&pic1,(int)uVar25);
    sVar16 = ReadPicture((char *)local_320,&pic2,keep_alpha);
    if ((sVar15 != 0) && (sVar16 != 0)) {
      if (!bVar5) {
        WebPBlendAlpha(&pic1,0);
        WebPBlendAlpha(&pic2,0);
      }
      iVar12 = WebPPictureDistortion(&pic1,&pic2,type,disto);
      if (iVar12 == 0) {
        pcVar33 = "Error while computing the distortion.\n";
        sStack_330 = 0x26;
      }
      else {
        printf("%u %.2f    %.2f %.2f %.2f %.2f [ %.2f bpp ]\n",(double)disto[4],(double)disto[0],
               (double)disto[1],(double)disto[2],(double)disto[3],
               (double)((((float)sVar15 * 8.0) / (float)pic1.width) / (float)pic1.height),
               sVar15 & 0xffffffff);
        iVar14 = 0;
        if (local_2b8 == (char *)0x0) goto LAB_001039a4;
        data = (uint8_t *)0x0;
        if (pic1.use_argb == pic2.use_argb) {
          if (pic1.use_argb == 0) {
            pcVar33 = "Can only compute the difference map in ARGB format.\n";
            sStack_330 = 0x34;
          }
          else {
            fwrite("max differences per channel: ",0x1d,1,stderr);
            lVar44 = 0;
            while (iVar13 = pic2.argb_stride, puVar10 = pic2.argb, puVar9 = pic1.argb,
                  iVar14 = pic1.height, iVar12 = pic1.width, lVar44 != 3) {
              plane = (uint8_t *)((long)pic1.argb + lVar44);
              x_stride = pic1.argb_stride << 2;
              lVar19 = (long)x_stride;
              local_2c0 = lVar44;
              if (type == 1) {
                lVar44 = (long)pic1.width;
                iVar45 = pic1.height * pic1.width;
                __ptr = malloc((long)(iVar45 * 2));
                if (__ptr != (void *)0x0) {
                  lVar20 = (long)__ptr + (long)iVar45;
                  local_2a8 = 0;
                  if (0 < iVar12) {
                    local_2a8 = (ulong)(uint)iVar12;
                  }
                  local_2b0 = 0;
                  if (0 < iVar14) {
                    local_2b0 = (ulong)(uint)iVar14;
                  }
                  lVar41 = (long)puVar10 + local_2c0;
                  lVar29 = (long)puVar9 + local_2c0;
                  pvVar32 = __ptr;
                  for (uVar35 = 0; uVar35 != local_2b0; uVar35 = uVar35 + 1) {
                    for (uVar36 = 0; local_2a8 != uVar36; uVar36 = uVar36 + 1) {
                      *(undefined1 *)((long)pvVar32 + uVar36) = *(undefined1 *)(lVar29 + uVar36 * 4)
                      ;
                      uVar1 = *(undefined1 *)(lVar41 + uVar36 * 4);
                      in_R9 = (uint8_t *)CONCAT71((int7)((ulong)in_R9 >> 8),uVar1);
                      *(undefined1 *)(lVar20 + uVar36) = uVar1;
                    }
                    lVar20 = lVar20 + lVar44;
                    pvVar32 = (void *)((long)pvVar32 + lVar44);
                    lVar41 = lVar41 + (iVar13 << 2);
                    lVar29 = lVar29 + lVar19;
                  }
                  local_2cc = iVar14 + -1;
                  local_2c8 = iVar12 + -1;
                  uVar30 = 0;
                  uVar35 = 0;
                  while( true ) {
                    uVar36 = uVar35;
                    iVar23 = (int)uVar36;
                    iVar13 = 3;
                    if (3 < iVar23) {
                      iVar13 = iVar23;
                    }
                    if (uVar36 == local_2b0) break;
                    uVar35 = 3;
                    if (3 < iVar23) {
                      uVar35 = uVar36;
                    }
                    iVar3 = iVar23 + 3;
                    if (local_2cc <= iVar23 + 3) {
                      iVar3 = local_2cc;
                    }
                    iVar18 = -3;
                    uVar26 = 0;
                    while( true ) {
                      iVar42 = (int)uVar26;
                      uVar17 = 3;
                      if (3 < iVar42) {
                        uVar17 = uVar26;
                      }
                      if (uVar26 == local_2a8) break;
                      local_320 = (byte *)((long)__ptr +
                                          (uVar17 & 0xffffffff) +
                                          (long)((iVar13 + -3) * iVar12) + (long)iVar45 + -3);
                      uVar22 = 3;
                      if (3 < iVar42) {
                        uVar22 = uVar26;
                      }
                      iVar4 = iVar42 + 3;
                      if (local_2c8 <= iVar42 + 3) {
                        iVar4 = local_2c8;
                      }
                      uVar37 = 0;
                      uVar28 = 0;
                      uVar31 = 0;
                      uVar40 = 0;
                      uVar34 = 0;
                      uVar24 = 0;
                      lVar20 = (long)(((int)uVar35 + -3) * iVar12) + (long)__ptr;
                      for (lVar29 = (uVar35 & 0xffffffff) - 3; lVar29 <= iVar3; lVar29 = lVar29 + 1)
                      {
                        pbVar21 = local_320;
                        lVar46 = ((ulong)(uint)((int)uVar17 + iVar18) << 0x20) + 0x300000000;
                        for (lVar41 = (uVar22 & 0xffffffff) - 3; lVar41 <= iVar4;
                            lVar41 = lVar41 + 1) {
                          iVar42 = kWeight[(long)(((ulong)(uint)((int)lVar29 - iVar23) << 0x20) +
                                                 0x300000000) >> 0x20] *
                                   *(int *)((long)kWeight + (lVar46 >> 0x1e));
                          iVar43 = iVar42 * (uint)*(byte *)(lVar20 + lVar41);
                          uVar40 = (ulong)((int)uVar40 + (uint)*(byte *)(lVar20 + lVar41) * iVar43);
                          bVar2 = *pbVar21;
                          uVar28 = uVar28 + iVar43;
                          uVar34 = uVar34 + iVar43 * (uint)bVar2;
                          uVar37 = (ulong)(uint)((int)uVar37 + iVar42);
                          iVar42 = iVar42 * (uint)bVar2;
                          uVar31 = uVar31 + iVar42;
                          uVar24 = uVar24 + iVar42 * (uint)bVar2;
                          pbVar21 = pbVar21 + 1;
                          lVar46 = lVar46 + 0x100000000;
                        }
                        lVar20 = lVar20 + lVar44;
                        local_320 = local_320 + lVar44;
                      }
                      uVar38 = (int)uVar37 * (int)uVar37;
                      in_R9 = (uint8_t *)(ulong)uVar38;
                      uVar39 = (ulong)uVar28;
                      uVar22 = (ulong)uVar31;
                      uVar17 = uVar22 * uVar22 + uVar39 * uVar39;
                      dVar47 = 1.0;
                      if (uVar38 * 0x40 <= uVar17) {
                        in_R9 = (uint8_t *)(ulong)(uVar38 * 0x14);
                        lVar20 = uVar34 * uVar37 - uVar22 * uVar39;
                        if (lVar20 < 1) {
                          lVar20 = 0;
                        }
                        lVar29 = (long)(in_R9 + uVar22 * uVar39 * 2) *
                                 ((ulong)(uVar38 * 0x3c) + lVar20 * 2 >> 8);
                        lVar20 = (long)(in_R9 + uVar17) *
                                 ((uVar38 * 0x3c - uVar17) + (uVar24 + uVar40) * uVar37 >> 8);
                        uVar51 = SUB164(ZEXT816(0x4530000043300000),4);
                        auVar48._8_4_ = (int)((ulong)lVar29 >> 0x20);
                        auVar48._0_8_ = lVar29;
                        auVar48._12_4_ = uVar51;
                        uVar50 = SUB164(ZEXT816(0x4530000043300000),0);
                        auVar49._8_4_ = (int)((ulong)lVar20 >> 0x20);
                        auVar49._0_8_ = lVar20;
                        auVar49._12_4_ = uVar51;
                        dVar47 = ((auVar48._8_8_ - 1.9342813113834067e+25) +
                                 ((double)CONCAT44(uVar50,(int)lVar29) - 4503599627370496.0)) /
                                 ((auVar49._8_8_ - 1.9342813113834067e+25) +
                                 ((double)CONCAT44(uVar50,(int)lVar20) - 4503599627370496.0));
                      }
                      uVar28 = (uint)((1.0 - dVar47) * 255.0);
                      uVar24 = uVar28;
                      if ((int)uVar28 < (int)uVar30) {
                        uVar24 = uVar30;
                      }
                      uVar31 = uVar30;
                      if (-1 < (int)uVar28) {
                        uVar31 = uVar24;
                      }
                      if ((int)uVar28 < 1) {
                        uVar28 = 0;
                      }
                      uVar11 = (uint8_t)uVar28;
                      if (0xfe < (int)uVar28) {
                        uVar11 = 0xff;
                      }
                      plane[uVar26 * 4 + uVar36 * lVar19] = uVar11;
                      uVar26 = uVar26 + 1;
                      iVar18 = iVar18 + -1;
                      local_2c4 = uVar30;
                      uVar30 = uVar31;
                    }
                    uVar35 = uVar36 + 1;
                    local_2a0 = uVar36;
                  }
                  free(__ptr);
                  goto joined_r0x00103b06;
                }
                fwrite("\nError computing diff map\n",0x1a,1,stderr);
                uVar30 = 0xffffffff;
              }
              else {
                uVar35 = 0;
                uVar36 = 0;
                if (0 < pic1.height) {
                  uVar36 = (ulong)(uint)pic1.height;
                }
                lVar44 = (long)pic2.argb + lVar44;
                uVar30 = 0;
                in_R9 = plane;
                for (; uVar35 != uVar36; uVar35 = uVar35 + 1) {
                  for (lVar20 = 0; lVar20 < (long)pic1.width * 4; lVar20 = lVar20 + 4) {
                    iVar13 = (uint)in_R9[lVar20] - (uint)*(byte *)(lVar44 + lVar20);
                    bVar2 = (byte)iVar13;
                    bVar27 = -bVar2;
                    if (0 < iVar13) {
                      bVar27 = bVar2;
                    }
                    if (uVar30 < bVar27) {
                      uVar30 = (uint)bVar27;
                    }
                    in_R9[lVar20] = bVar27;
                  }
                  lVar44 = lVar44 + (pic2.argb_stride << 2);
                  in_R9 = in_R9 + lVar19;
                }
joined_r0x00103b06:
                if (bVar6) {
                  RescalePlane(plane,iVar12,iVar14,x_stride,uVar30,(int)in_R9);
                }
              }
              fprintf(stderr,"[%d]",(ulong)uVar30);
              lVar44 = local_2c0 + 1;
            }
            fputc(10,stderr);
            if (bVar7) {
              for (iVar12 = 0; iVar12 < pic1.height; iVar12 = iVar12 + 1) {
                for (lVar44 = 0; lVar44 < pic1.width; lVar44 = lVar44 + 1) {
                  uVar30 = pic1.argb[pic1.argb_stride * iVar12 + lVar44];
                  pic1.argb[pic1.argb_stride * iVar12 + lVar44] =
                       (int)(long)((double)(uVar30 & 0xff) * 0.0722 +
                                   (double)(uVar30 >> 0x10 & 0xff) * 0.2126 +
                                   (double)(uVar30 >> 8 & 0xff) * 0.7152 + 0.5) * 0x10101 |
                       uVar30 & 0xff000000;
                }
              }
            }
            sVar15 = WebPEncodeLosslessBGRA
                               ((uint8_t *)pic1.argb,pic1.width,pic1.height,pic1.argb_stride << 2,
                                &data);
            if (sVar15 != 0) {
              iVar12 = ImgIoUtilWriteFile(local_2b8,data,sVar15);
              WebPFree(data);
              if (iVar12 == 0) {
                iVar14 = 1;
              }
              else {
                iVar14 = 0;
              }
              goto LAB_001039a4;
            }
            pcVar33 = "Error during lossless encoding.\n";
            sStack_330 = 0x20;
          }
        }
        else {
          pcVar33 = "Pictures are not in the same argb format. Can\'t save the difference map.\n";
          sStack_330 = 0x49;
        }
      }
      fwrite(pcVar33,sStack_330,1,stderr);
      iVar14 = local_328;
    }
  }
LAB_001039a4:
  WebPPictureFree(&pic1);
  WebPPictureFree(&pic2);
  return iVar14;
}

Assistant:

int main(int argc, const char* argv[]) {
  WebPPicture pic1, pic2;
  size_t size1 = 0, size2 = 0;
  int ret = EXIT_FAILURE;
  float disto[5];
  int type = 0;
  int c;
  int help = 0;
  int keep_alpha = 0;
  int scale = 0;
  int use_gray = 0;
  const char* name1 = NULL;
  const char* name2 = NULL;
  const char* output = NULL;

  INIT_WARGV(argc, argv);

  if (!WebPPictureInit(&pic1) || !WebPPictureInit(&pic2)) {
    fprintf(stderr, "Can't init pictures\n");
    FREE_WARGV_AND_RETURN(EXIT_FAILURE);
  }

  for (c = 1; c < argc; ++c) {
    if (!strcmp(argv[c], "-ssim")) {
      type = 1;
    } else if (!strcmp(argv[c], "-psnr")) {
      type = 0;
    } else if (!strcmp(argv[c], "-alpha")) {
      keep_alpha = 1;
    } else if (!strcmp(argv[c], "-scale")) {
      scale = 1;
    } else if (!strcmp(argv[c], "-gray")) {
      use_gray = 1;
    } else if (!strcmp(argv[c], "-h")) {
      help = 1;
      ret = EXIT_SUCCESS;
    } else if (!strcmp(argv[c], "-o")) {
      if (++c == argc) {
        fprintf(stderr, "missing file name after %s option.\n", argv[c - 1]);
        goto End;
      }
      output = (const char*)GET_WARGV(argv, c);
    } else if (name1 == NULL) {
      name1 = (const char*)GET_WARGV(argv, c);
    } else {
      name2 = (const char*)GET_WARGV(argv, c);
    }
  }
  if (help || name1 == NULL || name2 == NULL) {
    if (!help) {
      fprintf(stderr, "Error: missing arguments.\n");
    }
    Help();
    goto End;
  }
  size1 = ReadPicture(name1, &pic1, 1);
  size2 = ReadPicture(name2, &pic2, 1);
  if (size1 == 0 || size2 == 0) goto End;

  if (!keep_alpha) {
    WebPBlendAlpha(&pic1, 0x00000000);
    WebPBlendAlpha(&pic2, 0x00000000);
  }

  if (!WebPPictureDistortion(&pic1, &pic2, type, disto)) {
    fprintf(stderr, "Error while computing the distortion.\n");
    goto End;
  }
  printf("%u %.2f    %.2f %.2f %.2f %.2f [ %.2f bpp ]\n",
         (unsigned int)size1,
         disto[4], disto[0], disto[1], disto[2], disto[3],
         8.f * size1 / pic1.width / pic1.height);

  if (output != NULL) {
    uint8_t* data = NULL;
    size_t data_size = 0;
    if (pic1.use_argb != pic2.use_argb) {
      fprintf(stderr, "Pictures are not in the same argb format. "
                      "Can't save the difference map.\n");
      goto End;
    }
    if (pic1.use_argb) {
      int n;
      fprintf(stderr, "max differences per channel: ");
      for (n = 0; n < 3; ++n) {    // skip the alpha channel
        const int range = (type == 1) ?
          SSIMScaleChannel((uint8_t*)pic1.argb + n, pic1.argb_stride * 4,
                           (const uint8_t*)pic2.argb + n, pic2.argb_stride * 4,
                           4, pic1.width, pic1.height, scale) :
          DiffScaleChannel((uint8_t*)pic1.argb + n, pic1.argb_stride * 4,
                           (const uint8_t*)pic2.argb + n, pic2.argb_stride * 4,
                           4, pic1.width, pic1.height, scale);
        if (range < 0) fprintf(stderr, "\nError computing diff map\n");
        fprintf(stderr, "[%d]", range);
      }
      fprintf(stderr, "\n");
      if (use_gray) ConvertToGray(&pic1);
    } else {
      fprintf(stderr, "Can only compute the difference map in ARGB format.\n");
      goto End;
    }
#if !defined(WEBP_REDUCE_CSP)
    data_size = WebPEncodeLosslessBGRA((const uint8_t*)pic1.argb,
                                       pic1.width, pic1.height,
                                       pic1.argb_stride * 4,
                                       &data);
    if (data_size == 0) {
      fprintf(stderr, "Error during lossless encoding.\n");
      goto End;
    }
    ret = ImgIoUtilWriteFile(output, data, data_size) ? EXIT_SUCCESS
                                                      : EXIT_FAILURE;
    WebPFree(data);
    if (ret) goto End;
#else
    (void)data;
    (void)data_size;
    fprintf(stderr, "Cannot save the difference map. Please recompile "
                    "without the WEBP_REDUCE_CSP flag.\n");
    goto End;
#endif  // WEBP_REDUCE_CSP
  }
  ret = EXIT_SUCCESS;

 End:
  WebPPictureFree(&pic1);
  WebPPictureFree(&pic2);
  FREE_WARGV_AND_RETURN(ret);
}